

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_refs.c
# Opt level: O1

int refs_resize_help(refs_table_t *tbl)

{
  size_t *psVar1;
  ulong uVar2;
  uint64_t *puVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong *puVar9;
  int iVar10;
  ulong *puVar11;
  
  iVar5 = 0;
  if (((0xfffffff < tbl->refs_control) && (iVar5 = 1, -1 < (int)tbl->refs_control)) &&
     (tbl->refs_resize_part < tbl->refs_resize_size >> 7)) {
    LOCK();
    psVar1 = &tbl->refs_resize_part;
    uVar2 = *psVar1;
    *psVar1 = *psVar1 + 1;
    UNLOCK();
    if (uVar2 < tbl->refs_resize_size >> 7) {
      puVar9 = tbl->refs_resize_table + uVar2 * 0x80;
      iVar10 = 0;
      do {
        uVar2 = *puVar9;
        if ((uVar2 != 0) && (uVar2 != 0x7fffffffffffffff)) {
          uVar6 = uVar2 & 0xffffffffff;
          uVar7 = ((uVar6 ^ 0xcbf29ce484222325) * 0x100000001b3 ^ (uVar6 >> 0x27 | uVar6 << 0x19)) *
                  0x100000001b3;
          puVar3 = tbl->refs_table;
          uVar6 = tbl->refs_size;
          puVar11 = puVar3 + (uVar7 >> 0x20 ^ uVar7) % uVar6;
          iVar8 = -0x81;
          do {
            iVar8 = iVar8 + 1;
            if (iVar8 == 0) break;
            if (*puVar11 == 0) {
              bVar4 = false;
              LOCK();
              uVar7 = *puVar11;
              if (uVar7 == 0) {
                *puVar11 = uVar2;
              }
              UNLOCK();
              if (uVar7 != 0) goto LAB_001149c0;
            }
            else {
LAB_001149c0:
              puVar11 = puVar11 + 1;
              bVar4 = true;
              if (puVar11 == puVar3 + uVar6) {
                puVar11 = tbl->refs_table;
              }
            }
          } while (bVar4);
        }
        puVar9 = puVar9 + 1;
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x80);
      LOCK();
      tbl->refs_resize_done = tbl->refs_resize_done + 1;
      UNLOCK();
    }
  }
  return iVar5;
}

Assistant:

static int
refs_resize_help(refs_table_t *tbl)
{
    // TODO optimize??
    if (0 == (tbl->refs_control & 0xf0000000)) return 0; // no resize in progress (anymore)
    if (tbl->refs_control & 0x80000000) return 1; // still waiting for preparation

    if (tbl->refs_resize_part >= tbl->refs_resize_size / 128) return 1; // all parts claimed
    size_t part = atomic_fetch_add(&tbl->refs_resize_part, 1);
    if (part >= tbl->refs_resize_size/128) return 1; // all parts claimed

    // rehash all
    int i;
    _Atomic(uint64_t) *bucket = tbl->refs_resize_table + part * 128;
    for (i=0; i<128; i++) {
        refs_rehash(tbl, atomic_load_explicit(bucket, memory_order_relaxed));
        bucket++;
    }

    atomic_fetch_add(&tbl->refs_resize_done, 1);
    return 1;
}